

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintgb.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::VarIntGB<false>::decodeArray
          (VarIntGB<false> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  ulong uVar1;
  byte bVar2;
  ushort uVar3;
  uint3 uVar4;
  uint *puVar5;
  byte bVar6;
  uint32_t *puVar7;
  uint32_t *in_RCX;
  long in_RDX;
  uint *in_RSI;
  VarIntGB<false> *in_RDI;
  ulong *in_R8;
  uint32_t howmanybyte;
  int k;
  uint8_t key;
  uint32_t val;
  uint32_t *endout;
  uint8_t *endbyte;
  uint8_t *inbyte;
  uint32_t prev;
  int local_54;
  byte local_4d;
  uint local_4c;
  uint *local_38;
  uint32_t *local_20;
  
  *in_R8 = (ulong)*in_RSI;
  local_38 = in_RSI + 1;
  uVar1 = *in_R8;
  local_20 = in_RCX;
  while ((uint *)((long)local_38 + 0x11) < in_RSI + in_RDX) {
    local_38 = (uint *)decodeGroupVarInt(in_RDI,(uint8_t *)local_38,local_20);
    local_20 = local_20 + 4;
  }
  while (local_38 < in_RSI + in_RDX) {
    local_4d = (byte)*local_38;
    local_38 = (uint *)((long)local_38 + 1);
    for (local_54 = 0; local_20 < in_RCX + uVar1 && local_54 < 4; local_54 = local_54 + 1) {
      bVar2 = local_4d & 3;
      bVar6 = local_4d & 3;
      local_4d = (byte)((int)(uint)local_4d >> 2);
      local_4c = (uint)(byte)*local_38;
      puVar5 = (uint *)((long)local_38 + 1);
      if (bVar2 != 0) {
        uVar3 = CONCAT11(*(byte *)((long)local_38 + 1),(byte)*local_38);
        local_4c = (uint)uVar3;
        puVar5 = (uint *)((long)local_38 + 2);
        if (1 < bVar6) {
          uVar4 = CONCAT12(*(byte *)((long)local_38 + 2),uVar3);
          local_4c = (uint)uVar4;
          puVar5 = (uint *)((long)local_38 + 3);
          if (2 < bVar6) {
            local_4c = CONCAT13(*(byte *)((long)local_38 + 3),uVar4);
            puVar5 = local_38 + 1;
          }
        }
      }
      local_38 = puVar5;
      *local_20 = local_4c;
      local_20 = local_20 + 1;
    }
  }
  puVar7 = (uint32_t *)padTo32bits<unsigned_char>((uchar *)local_38);
  return puVar7;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t length,
                              uint32_t *out, size_t &nvalue) {
    uint32_t prev = 0; // for delta

    const uint8_t *inbyte = reinterpret_cast<const uint8_t *>(in);
    nvalue = *in;
    inbyte += 4;

    const uint8_t *const endbyte =
        reinterpret_cast<const uint8_t *>(in + length);
    const uint32_t *const endout(out + nvalue);
    uint32_t val;

    while (endbyte > inbyte + 1 + 4 * 4) {
      inbyte = delta ? decodeGroupVarIntDelta(inbyte, &prev, out)
                     : decodeGroupVarInt(inbyte, out);
      out += 4;
    }
    while (endbyte > inbyte) {
      uint8_t key = *inbyte++;
      for (int k = 0; out < endout and k < 4; k++) {
        const uint32_t howmanybyte = key & 3;
        key = static_cast<uint8_t>(key >> 2);
        val = static_cast<uint32_t>(*inbyte++);
        if (howmanybyte >= 1) {
          val |= (static_cast<uint32_t>(*inbyte++) << 8);
          if (howmanybyte >= 2) {
            val |= (static_cast<uint32_t>(*inbyte++) << 16);
            if (howmanybyte >= 3) {
              val |= (static_cast<uint32_t>(*inbyte++) << 24);
            }
          }
        }
        prev = (delta ? prev : 0) + val;
        *out++ = prev;
      }
      assert(inbyte <= endbyte);
    }
    inbyte = padTo32bits(inbyte);
    return reinterpret_cast<const uint32_t *>(inbyte);
  }